

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_Apu.cpp
# Opt level: O0

void __thiscall Simple_Apu::end_frame(Simple_Apu *this)

{
  ulong uVar1;
  Nes_Apu *in_RDI;
  blip_time_t in_stack_ffffffffffffffe8;
  
  in_RDI[1].square1.super_Nes_Envelope.envelope = 0;
  in_RDI[1].square1.super_Nes_Envelope.env_delay = 0;
  uVar1._0_4_ = in_RDI[1].square1.phase;
  uVar1._4_4_ = in_RDI[1].square1.sweep_delay;
  in_RDI[1].square1.phase = (int)(uVar1 ^ 1);
  in_RDI[1].square1.sweep_delay = (int)((uVar1 ^ 1) >> 0x20);
  Nes_Apu::end_frame(in_RDI,in_stack_ffffffffffffffe8);
  Blip_Buffer::end_frame((Blip_Buffer *)in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void Simple_Apu::end_frame()
{
	time = 0;
	frame_length ^= 1;
	apu.end_frame( frame_length );
	buf.end_frame( frame_length );
}